

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# search.cc
# Opt level: O3

void Search::search_finish(search *sch)

{
  search_private *priv;
  hash_elem *__ptr;
  pointer pcVar1;
  pointer puVar2;
  int *__ptr_00;
  unsigned_long *__ptr_01;
  wclass *pwVar3;
  uint *puVar4;
  pair<float,_unsigned_long> *__ptr_02;
  void *__ptr_03;
  polylabel *ppVar5;
  scored_action *__ptr_04;
  action_repr *paVar6;
  v_array<Search::action_cache> **__ptr_05;
  example *peVar7;
  _func_void_void_ptr *delete_label;
  char *__ptr_06;
  _func_void_search_ptr *p_Var8;
  undefined **ppuVar9;
  ostream *poVar10;
  long lVar11;
  ulong uVar12;
  action_repr *ar;
  undefined8 *puVar13;
  v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *__ptr_07;
  action_repr *paVar14;
  example *ec;
  
  priv = sch->priv;
  clear_cache_hash_map(priv);
  if (priv->truth_string != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->truth_string + 8))();
  }
  if (priv->pred_string != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->pred_string + 8))();
  }
  if (priv->bad_string_stream != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->bad_string_stream + 8))();
  }
  __ptr = (priv->cache_hash_map).dat._begin;
  if (__ptr != (hash_elem *)0x0) {
    free(__ptr);
  }
  (priv->cache_hash_map).dat._begin = (hash_elem *)0x0;
  (priv->cache_hash_map).dat._end = (hash_elem *)0x0;
  (priv->cache_hash_map).dat.end_array = (hash_elem *)0x0;
  pcVar1 = (priv->rawOutputString)._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != &(priv->rawOutputString).field_2) {
    operator_delete(pcVar1);
  }
  puVar2 = (priv->test_action_sequence).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar2 != (pointer)0x0) {
    operator_delete(puVar2);
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&priv->dat_new_feature_audit_ss);
  std::ios_base::~ios_base((ios_base *)&priv->field_0x3d8);
  __ptr_00 = (priv->neighbor_features)._begin;
  if (__ptr_00 != (int *)0x0) {
    free(__ptr_00);
  }
  (priv->neighbor_features)._begin = (int *)0x0;
  (priv->neighbor_features)._end = (int *)0x0;
  (priv->neighbor_features).end_array = (int *)0x0;
  __ptr_01 = (priv->timesteps)._begin;
  if (__ptr_01 != (unsigned_long *)0x0) {
    free(__ptr_01);
  }
  (priv->timesteps)._begin = (unsigned_long *)0x0;
  (priv->timesteps)._end = (unsigned_long *)0x0;
  (priv->timesteps).end_array = (unsigned_long *)0x0;
  pwVar3 = (priv->learn_losses).cs.costs._begin;
  if (pwVar3 != (wclass *)0x0) {
    free(pwVar3);
  }
  (priv->learn_losses).cs.costs._begin = (wclass *)0x0;
  (priv->learn_losses).cs.costs._end = (wclass *)0x0;
  (priv->learn_losses).cs.costs.end_array = (wclass *)0x0;
  pwVar3 = (priv->gte_label).cs.costs._begin;
  if (pwVar3 != (wclass *)0x0) {
    free(pwVar3);
  }
  (priv->gte_label).cs.costs._begin = (wclass *)0x0;
  (priv->gte_label).cs.costs._end = (wclass *)0x0;
  (priv->gte_label).cs.costs.end_array = (wclass *)0x0;
  paVar14 = (priv->condition_on_actions)._begin;
  if (paVar14 != (action_repr *)0x0) {
    free(paVar14);
  }
  (priv->condition_on_actions)._begin = (action_repr *)0x0;
  (priv->condition_on_actions)._end = (action_repr *)0x0;
  (priv->condition_on_actions).end_array = (action_repr *)0x0;
  puVar4 = (priv->learn_allowed_actions)._begin;
  if (puVar4 != (uint *)0x0) {
    free(puVar4);
  }
  (priv->learn_allowed_actions)._begin = (uint *)0x0;
  (priv->learn_allowed_actions)._end = (uint *)0x0;
  (priv->learn_allowed_actions).end_array = (uint *)0x0;
  pwVar3 = (priv->ldf_test_label).costs._begin;
  if (pwVar3 != (wclass *)0x0) {
    free(pwVar3);
  }
  (priv->ldf_test_label).costs._begin = (wclass *)0x0;
  (priv->ldf_test_label).costs._end = (wclass *)0x0;
  (priv->ldf_test_label).costs.end_array = (wclass *)0x0;
  features::delete_v(&priv->last_action_repr);
  __ptr_02 = (priv->active_uncertainty)._begin;
  if (__ptr_02 != (pair<float,_unsigned_long> *)0x0) {
    free(__ptr_02);
  }
  (priv->active_uncertainty)._begin = (pair<float,_unsigned_long> *)0x0;
  (priv->active_uncertainty)._end = (pair<float,_unsigned_long> *)0x0;
  (priv->active_uncertainty).end_array = (pair<float,_unsigned_long> *)0x0;
  __ptr_07 = (priv->active_known)._begin;
  if ((priv->active_known)._end != __ptr_07) {
    lVar11 = 0;
    uVar12 = 0;
    do {
      __ptr_03 = *(void **)((long)&__ptr_07->_begin + lVar11);
      if (__ptr_03 != (void *)0x0) {
        free(__ptr_03);
      }
      puVar13 = (undefined8 *)((long)&__ptr_07->_begin + lVar11);
      *puVar13 = 0;
      puVar13[1] = 0;
      puVar13[2] = 0;
      uVar12 = uVar12 + 1;
      __ptr_07 = (priv->active_known)._begin;
      lVar11 = lVar11 + 0x20;
    } while (uVar12 < (ulong)((long)(priv->active_known)._end - (long)__ptr_07 >> 5));
  }
  if (__ptr_07 != (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0) {
    free(__ptr_07);
  }
  (priv->active_known)._begin = (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0;
  (priv->active_known)._end = (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0;
  (priv->active_known).end_array = (v_array<std::pair<COST_SENSITIVE::wclass_&,_bool>_> *)0x0;
  ppVar5 = priv->allowed_actions_cache;
  pwVar3 = (ppVar5->cs).costs._begin;
  if (pwVar3 != (wclass *)0x0) {
    free(pwVar3);
  }
  (ppVar5->cs).costs._begin = (wclass *)0x0;
  (ppVar5->cs).costs._end = (wclass *)0x0;
  (ppVar5->cs).costs.end_array = (wclass *)0x0;
  __ptr_04 = (priv->train_trajectory)._begin;
  if (__ptr_04 != (scored_action *)0x0) {
    free(__ptr_04);
  }
  (priv->train_trajectory)._begin = (scored_action *)0x0;
  (priv->train_trajectory)._end = (scored_action *)0x0;
  (priv->train_trajectory).end_array = (scored_action *)0x0;
  paVar14 = (priv->ptag_to_action)._begin;
  paVar6 = (priv->ptag_to_action)._end;
  if (paVar14 != paVar6) {
    do {
      if (paVar14->repr != (features *)0x0) {
        features::delete_v(paVar14->repr);
        operator_delete(paVar14->repr);
      }
      paVar14 = paVar14 + 1;
    } while (paVar14 != paVar6);
    paVar14 = (priv->ptag_to_action)._begin;
  }
  if (paVar14 != (action_repr *)0x0) {
    free(paVar14);
  }
  (priv->ptag_to_action)._begin = (action_repr *)0x0;
  (priv->ptag_to_action)._end = (action_repr *)0x0;
  (priv->ptag_to_action).end_array = (action_repr *)0x0;
  clear_memo_foreach_action(priv);
  __ptr_05 = (priv->memo_foreach_action)._begin;
  if (__ptr_05 != (v_array<Search::action_cache> **)0x0) {
    free(__ptr_05);
  }
  (priv->memo_foreach_action)._begin = (v_array<Search::action_cache> **)0x0;
  (priv->memo_foreach_action)._end = (v_array<Search::action_cache> **)0x0;
  (priv->memo_foreach_action).end_array = (v_array<Search::action_cache> **)0x0;
  if (priv->examples_dont_change == false) {
    if (priv->is_ldf == false) {
      ppuVar9 = &MULTICLASS::mc_label;
    }
    else {
      ppuVar9 = &COST_SENSITIVE::cs_label;
    }
    ec = (priv->learn_ec_copy)._begin;
    peVar7 = (priv->learn_ec_copy)._end;
    if (ec != peVar7) {
      delete_label = (_func_void_void_ptr *)ppuVar9[4];
      do {
        VW::dealloc_example(delete_label,ec,(_func_void_void_ptr *)0x0);
        ec = ec + 1;
      } while (ec != peVar7);
      ec = (priv->learn_ec_copy)._begin;
    }
    if (ec != (example *)0x0) {
      free(ec);
    }
    (priv->learn_ec_copy)._begin = (example *)0x0;
    (priv->learn_ec_copy)._end = (example *)0x0;
    (priv->learn_ec_copy).end_array = (example *)0x0;
  }
  __ptr_06 = (priv->learn_condition_on_names)._begin;
  if (__ptr_06 != (char *)0x0) {
    free(__ptr_06);
  }
  (priv->learn_condition_on_names)._begin = (char *)0x0;
  (priv->learn_condition_on_names)._end = (char *)0x0;
  (priv->learn_condition_on_names).end_array = (char *)0x0;
  puVar4 = (priv->learn_condition_on)._begin;
  if (puVar4 != (uint *)0x0) {
    free(puVar4);
  }
  (priv->learn_condition_on)._begin = (uint *)0x0;
  (priv->learn_condition_on)._end = (uint *)0x0;
  (priv->learn_condition_on).end_array = (uint *)0x0;
  paVar14 = (priv->learn_condition_on_act)._begin;
  if (paVar14 != (action_repr *)0x0) {
    free(paVar14);
  }
  (priv->learn_condition_on_act)._begin = (action_repr *)0x0;
  (priv->learn_condition_on_act)._end = (action_repr *)0x0;
  (priv->learn_condition_on_act).end_array = (action_repr *)0x0;
  if (priv->active_csoaa == true) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"search calls to run = ",0x16);
    poVar10 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)poVar10->_vptr_basic_ostream[-3] + (char)poVar10);
    std::ostream::put((char)poVar10);
    std::ostream::flush();
  }
  p_Var8 = priv->task->finish;
  if (p_Var8 != (_func_void_search_ptr *)0x0) {
    (*p_Var8)(sch);
  }
  if ((priv->metatask != (search_metatask *)0x0) &&
     (p_Var8 = priv->metatask->finish, p_Var8 != (_func_void_search_ptr *)0x0)) {
    (*p_Var8)(sch);
  }
  free(priv->allowed_actions_cache);
  if (priv->rawOutputStringStream != (stringstream *)0x0) {
    (**(code **)(*(long *)priv->rawOutputStringStream + 8))();
  }
  free(sch->priv);
  return;
}

Assistant:

void search_finish(search& sch)
{
  search_private& priv = *sch.priv;
  cdbg << "search_finish" << endl;

  clear_cache_hash_map(priv);

  delete priv.truth_string;
  delete priv.pred_string;
  delete priv.bad_string_stream;
  priv.cache_hash_map.~v_hashmap<unsigned char*, scored_action>();
  priv.rawOutputString.~string();
  priv.test_action_sequence.~vector<action>();
  priv.dat_new_feature_audit_ss.~stringstream();
  priv.neighbor_features.delete_v();
  priv.timesteps.delete_v();
  if (priv.cb_learner)
    priv.learn_losses.cb.costs.delete_v();
  else
    priv.learn_losses.cs.costs.delete_v();
  if (priv.cb_learner)
    priv.gte_label.cb.costs.delete_v();
  else
    priv.gte_label.cs.costs.delete_v();

  priv.condition_on_actions.delete_v();
  priv.learn_allowed_actions.delete_v();
  priv.ldf_test_label.costs.delete_v();
  priv.last_action_repr.delete_v();
  priv.active_uncertainty.delete_v();
  for (size_t i = 0; i < priv.active_known.size(); i++) priv.active_known[i].delete_v();
  priv.active_known.delete_v();

  if (priv.cb_learner)
    priv.allowed_actions_cache->cb.costs.delete_v();
  else
    priv.allowed_actions_cache->cs.costs.delete_v();

  priv.train_trajectory.delete_v();
  for (Search::action_repr& ar : priv.ptag_to_action)
  {
    if (ar.repr != nullptr)
    {
      ar.repr->delete_v();
      delete ar.repr;
      cdbg << "delete_v" << endl;
    }
  }
  priv.ptag_to_action.delete_v();
  clear_memo_foreach_action(priv);
  priv.memo_foreach_action.delete_v();

  // destroy copied examples if we needed them
  if (!priv.examples_dont_change)
  {
    void (*delete_label)(void*) = priv.is_ldf ? CS::cs_label.delete_label : MC::mc_label.delete_label;
    for (example& ec : priv.learn_ec_copy) VW::dealloc_example(delete_label, ec);
    priv.learn_ec_copy.delete_v();
  }
  priv.learn_condition_on_names.delete_v();
  priv.learn_condition_on.delete_v();
  priv.learn_condition_on_act.delete_v();

  if (priv.active_csoaa)
    std::cerr << "search calls to run = " << priv.num_calls_to_run << endl;

  if (priv.task->finish)
    priv.task->finish(sch);
  if (priv.metatask && priv.metatask->finish)
    priv.metatask->finish(sch);

  free(priv.allowed_actions_cache);
  delete priv.rawOutputStringStream;
  free(sch.priv);
}